

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie_node.cpp
# Opt level: O0

size_t la::trie_node::convertIndex(char *c)

{
  char *c_local;
  
  if ((*c < 'a') || ('z' < *c)) {
    if ((*c < '0') || ('9' < *c)) {
      if (*c == '_') {
        c_local = (char *)0x25;
      }
      else if (*c == ',') {
        c_local = (char *)0x26;
      }
      else {
        if (*c != '.') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/charleswu52[P]LA_CPlusPlus/src/levenshtein_automaton/trie_node.cpp"
                        ,0x1f,"static std::size_t la::trie_node::convertIndex(const char &)");
        }
        c_local = (char *)0x27;
      }
    }
    else {
      c_local = (char *)(long)(*c + -0x16);
    }
  }
  else {
    c_local = (char *)(long)(*c + -0x61);
  }
  return (size_t)c_local;
}

Assistant:

std::size_t
    trie_node::convertIndex(const char &c)
    {
        if ('a' <= c && c <= 'z')
            return c - 'a';
        if ('0' <= c && c <= '9')
            return c - '0' + 26;
        if (c == '_')
            return 26 + 10 + 1;
        if (c == ',')
            return 26 + 10 + 2;
        if (c == '.')
            return 26 + 10 + 3;
        assert(false);
        return 0;
    }